

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O2

void __thiscall hwtest::pgraph::anon_unknown_8::MthdSurfFormat::emulate_mthd(MthdSurfFormat *this)

{
  uint uVar1;
  uint32_t uVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uStack_8;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type;
  if ((int)uVar1 < 4) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
    bVar3 = (byte)((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_switch_a >>
                  0xe) & 0xc;
    uVar4 = 6;
    if ((uVar1 >> 0x10 & 1) != 0) {
      uVar4 = uVar1 & 1 ^ 5;
    }
    if ((uVar1 >> 0x18 & 1) == 0) {
      uVar4 = 7;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.surf_format =
         uVar4 << bVar3 |
         ~(7 << bVar3) & (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.surf_format
    ;
    return;
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.cls & 3;
  if (uVar2 == 0x1010001) {
    uVar2 = (uint)(uVar4 != 3) * 5 + 1;
    uStack_8 = 6;
  }
  else {
    if (uVar2 == 0x1000000) {
      uStack_8 = 2 - (0x1f < uVar1 && uVar4 == 3);
      goto LAB_001b0cf7;
    }
    if (uVar2 == 0x1010000) {
      uStack_8 = 1;
      goto LAB_001b0cf7;
    }
    if (uVar2 != 1) {
      uStack_8 = 0;
      goto LAB_001b0cf7;
    }
    uVar2 = (uint)(uVar4 != 3) * 5 + 2;
    uStack_8 = 7;
  }
  if (0x1f < uVar1) {
    uStack_8 = uVar2;
  }
LAB_001b0cf7:
  pgraph_set_surf_format
            (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,uVar4,uStack_8);
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type < 4) {
			int which = extr(exp.ctx_switch_a, 16, 2);
			int f = 1;
			if (extr(val, 0, 1))
				f = 0;
			if (!extr(val, 16, 1))
				f = 2;
			if (!extr(val, 24, 1))
				f = 3;
			insrt(exp.surf_format, 4*which, 3, f | 4);
		} else {
			int which = cls & 3;
			int fmt = 0;
			if (val == 1) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 2;
				else
					fmt = 7;
			} else if (val == 0x01010000) {
				fmt = 1;
			} else if (val == 0x01000000) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 1;
				else
					fmt = 2;
			} else if (val == 0x01010001) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 1;
				else
					fmt = 6;
			}
			pgraph_set_surf_format(&exp, which, fmt);
		}
	}